

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::internal::GeneratedMessageReflection::
GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 offset;
  OneofDescriptor *pOVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pOVar2 = FieldDescriptor::containing_oneof(field);
  if ((pOVar2 != (OneofDescriptor *)0x0) && (bVar1 = HasOneofField(this,message,field), !bVar1)) {
    pRVar3 = DefaultRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,field);
    return pRVar3;
  }
  offset = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  pRVar3 = (anonymous_namespace)::
           GetConstRefAtOffset<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                     (message,offset);
  return pRVar3;
}

Assistant:

const Type& GeneratedMessageReflection::GetRaw(
    const Message& message, const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}